

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Node::loadFinalSchema::anon_class_24_3_f55ba8ed::operator()
          (anon_class_24_3_f55ba8ed *this)

{
  Node *pNVar1;
  Schema local_80;
  Reader local_78;
  anon_class_8_1_5fb92151 local_48;
  Mapper<kj::Array<capnp::schema::Node::Reader>_&> local_40;
  Array<capnp::Schema> local_38;
  Reader *local_20;
  Reader *finalSchema;
  Reader *_finalSchema649;
  anon_class_24_3_f55ba8ed *this_local;
  
  pNVar1 = this->this;
  _finalSchema649 = (Reader *)this;
  local_20 = kj::_::readMaybe<capnp::schema::Node::Reader>(&this->content->finalSchema);
  if (local_20 != (Reader *)0x0) {
    finalSchema = local_20;
    kj::_::Mapper<kj::Array<capnp::schema::Node::Reader>_&>::Mapper
              (&local_40,&this->content->auxSchemas);
    local_48.loader = this->loader;
    kj::_::Mapper<kj::Array<capnp::schema::Node::Reader>_&>::
    operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:648:5)>
              (&local_38,&local_40,&local_48);
    kj::Array<capnp::Schema>::~Array(&local_38);
    local_80 = SchemaLoader::loadOnce(this->loader,local_20);
    Schema::getProto(&local_78,&local_80);
    kj::Maybe<capnp::schema::Node::Reader>::operator=(&pNVar1->loadedFinalSchema,&local_78);
  }
  return;
}

Assistant:

KJ_IF_SOME(content, getContent(Content::FINISHED)) {
    KJ_IF_SOME(exception, kj::runCatchingExceptions([&](){
      KJ_IF_SOME(finalSchema, content.finalSchema) {
        KJ_MAP(auxSchema, content.auxSchemas) {
          return loader.loadOnce(auxSchema);
        };
        loadedFinalSchema = loader.loadOnce(finalSchema).getProto();
      }
    })) {
      // Schema validation threw an exception.

      // Don't try loading this again.
      content.finalSchema = kj::none;

      // Only bother to report validation failures if we think we haven't seen any errors.
      // Otherwise we assume that the errors caused the validation failure.
      if (!module->getErrorReporter().hadErrors()) {
        addError(kj::str("Internal compiler bug: Schema failed validation:\n", exception));
      }
    }
  }